

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void mi_process_init(void)

{
  _Bool _Var1;
  size_t pages;
  long lVar2;
  
  mi_heap_main_init();
  if (mi_process_init::process_init == 0) {
    LOCK();
    mi_process_init::process_init = 1;
    UNLOCK();
    _mi_process_is_initialized = true;
    _mi_verbose_message("process init: 0x%zx\n");
    mi_process_setup_auto_thread_done();
    _mi_os_init();
    mi_heap_main_init();
    mi_thread_init();
    mi_stats_reset();
    _Var1 = mi_option_is_enabled(mi_option_reserve_huge_os_pages);
    if (_Var1) {
      pages = mi_option_get_clamp(mi_option_reserve_huge_os_pages,0,0x20000);
      lVar2 = mi_option_get(mi_option_reserve_huge_os_pages_at);
      if (lVar2 == -1) {
        mi_reserve_huge_os_pages_interleave(pages,0,pages * 500);
      }
      else {
        mi_reserve_huge_os_pages_at(pages,(int)lVar2,pages * 500);
      }
    }
    _Var1 = mi_option_is_enabled(mi_option_reserve_os_memory);
    if ((_Var1) && (lVar2 = mi_option_get(mi_option_reserve_os_memory), 0 < lVar2)) {
      mi_reserve_os_memory(lVar2 << 10,true,true);
      return;
    }
  }
  return;
}

Assistant:

void mi_process_init(void) mi_attr_noexcept {
  // ensure we are called once
  static mi_atomic_once_t process_init;
	#if _MSC_VER < 1920
	mi_heap_main_init(); // vs2017 can dynamically re-initialize _mi_heap_main
	#endif
  if (!mi_atomic_once(&process_init)) return;
  _mi_process_is_initialized = true;
  _mi_verbose_message("process init: 0x%zx\n", _mi_thread_id());
  mi_process_setup_auto_thread_done();

  mi_detect_cpu_features();
  _mi_os_init();
  mi_heap_main_init();
  mi_thread_init();

  #if defined(_WIN32)
  // On windows, when building as a static lib the FLS cleanup happens to early for the main thread.
  // To avoid this, set the FLS value for the main thread to NULL so the fls cleanup
  // will not call _mi_thread_done on the (still executing) main thread. See issue #508.
  _mi_prim_thread_associate_default_heap(NULL);
  #endif

  mi_stats_reset();  // only call stat reset *after* thread init (or the heap tld == NULL)
  mi_track_init();

  if (mi_option_is_enabled(mi_option_reserve_huge_os_pages)) {
    size_t pages = mi_option_get_clamp(mi_option_reserve_huge_os_pages, 0, 128*1024);
    long reserve_at = mi_option_get(mi_option_reserve_huge_os_pages_at);
    if (reserve_at != -1) {
      mi_reserve_huge_os_pages_at(pages, reserve_at, pages*500);
    } else {
      mi_reserve_huge_os_pages_interleave(pages, 0, pages*500);
    }
  }
  if (mi_option_is_enabled(mi_option_reserve_os_memory)) {
    long ksize = mi_option_get(mi_option_reserve_os_memory);
    if (ksize > 0) {
      mi_reserve_os_memory((size_t)ksize*MI_KiB, true /* commit? */, true /* allow large pages? */);
    }
  }
}